

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

value_type * __thiscall
DictionaryInstance::op_values
          (DictionaryInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  bool bVar1;
  size_type sVar2;
  undefined8 *puVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> *in_RSI;
  value_type *in_RDI;
  vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> *in_stack_00000028;
  iterator it;
  vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> values;
  map<std::shared_ptr<Instance>,_std::shared_ptr<Instance>,_InstanceIsLessThanComparator,_std::allocator<std::pair<const_std::shared_ptr<Instance>,_std::shared_ptr<Instance>_>_>_>
  *in_stack_ffffffffffffff88;
  value_type *__x;
  _Self local_40;
  _Self local_38 [7];
  
  __x = in_RDI;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDX);
  if (sVar2 != 0) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::vector
            ((vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> *)
             0x1c3f6b);
  local_38[0]._M_node =
       (_Base_ptr)
       std::
       map<std::shared_ptr<Instance>,_std::shared_ptr<Instance>,_InstanceIsLessThanComparator,_std::allocator<std::pair<const_std::shared_ptr<Instance>,_std::shared_ptr<Instance>_>_>_>
       ::begin(in_stack_ffffffffffffff88);
  while( true ) {
    local_40._M_node =
         (_Base_ptr)
         std::
         map<std::shared_ptr<Instance>,_std::shared_ptr<Instance>,_InstanceIsLessThanComparator,_std::allocator<std::pair<const_std::shared_ptr<Instance>,_std::shared_ptr<Instance>_>_>_>
         ::end(in_stack_ffffffffffffff88);
    bVar1 = std::operator!=(local_38,&local_40);
    if (!bVar1) break;
    std::_Rb_tree_iterator<std::pair<const_std::shared_ptr<Instance>,_std::shared_ptr<Instance>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::shared_ptr<Instance>,_std::shared_ptr<Instance>_>_>
                  *)0x1c3fb6);
    std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::push_back
              (in_RSI,__x);
    std::_Rb_tree_iterator<std::pair<const_std::shared_ptr<Instance>,_std::shared_ptr<Instance>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::shared_ptr<Instance>,_std::shared_ptr<Instance>_>_>
                  *)__x,(int)((ulong)in_RDI >> 0x20));
  }
  vector_representation_abi_cxx11_(in_stack_00000028);
  std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::~vector
            (in_RSI);
  return __x;
}

Assistant:

std::string DictionaryInstance::op_values(const std::vector<std::string>& arguments) {
    if (arguments.size() != 0)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    std::vector<std::shared_ptr<Instance>> values;
    for (auto it = _value.begin(); it != _value.end(); it++)
        values.push_back(it->second);
    return vector_representation(values);
}